

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qhstspolicy.cpp
# Opt level: O3

void __thiscall QHstsPolicy::QHstsPolicy(QHstsPolicy *this)

{
  QHstsPolicyPrivate *pQVar1;
  
  pQVar1 = (QHstsPolicyPrivate *)operator_new(0x20);
  (pQVar1->super_QSharedData).ref.super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value
       = (Type)0x0;
  QUrl::QUrl(&pQVar1->url);
  QDateTime::QDateTime(&pQVar1->expiry);
  pQVar1->includeSubDomains = false;
  (this->d).d.ptr = pQVar1;
  LOCK();
  (pQVar1->super_QSharedData).ref.super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value
       = (Type)((int)(pQVar1->super_QSharedData).ref.super_QAtomicInteger<int>.
                     super_QBasicAtomicInteger<int>._q_value + 1);
  UNLOCK();
  return;
}

Assistant:

QHstsPolicy::QHstsPolicy() : d(new QHstsPolicyPrivate)
{
}